

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

vec<4,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar10;
  char cVar11;
  char cVar12;
  CanonicalDataSource CVar13;
  long *plVar14;
  undefined8 *puVar15;
  ulong *puVar16;
  size_type *psVar17;
  size_t sVar18;
  ulong uVar19;
  _Alloc_hider _Var20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uvec4 uVar22;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar23;
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  undefined1 auVar24 [12];
  undefined8 uVar25;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar13 = currentCanonicalDataSource(this);
  if (CVar13 != RenderBuffer) {
    if (CVar13 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4)) goto LAB_00229844;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar16 = puVar15 + 2;
      if ((ulong *)*puVar15 == puVar16) {
        local_b8 = *puVar16;
        lStack_b0 = puVar15[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar16;
        local_c8 = (ulong *)*puVar15;
      }
      local_c0 = puVar15[1];
      *puVar15 = puVar16;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      cVar12 = '\x01';
      if (9 < ind) {
        sVar18 = ind;
        cVar11 = '\x04';
        do {
          cVar12 = cVar11;
          if (sVar18 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_002296b9;
          }
          if (sVar18 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_002296b9;
          }
          if (sVar18 < 10000) goto LAB_002296b9;
          bVar9 = 99999 < sVar18;
          sVar18 = sVar18 / 10000;
          cVar11 = cVar12 + '\x04';
        } while (bVar9);
        cVar12 = cVar12 + '\x01';
      }
LAB_002296b9:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar19 = 0xf;
      if (local_c8 != &local_b8) {
        uVar19 = local_b8;
      }
      if (uVar19 < uVar2) {
        uVar19 = 0xf;
        if (local_108 != local_f8) {
          uVar19 = local_f8[0];
        }
        if (uVar19 < uVar2) goto LAB_0022971b;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_0022971b:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar15 + 2;
      if ((undefined8 *)*puVar15 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar15[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar15;
      }
      local_e0 = puVar15[1];
      *puVar15 = puVar1;
      puVar15[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar21 = &local_68.field_2;
      psVar17 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_68.field_2._M_allocated_capacity = *psVar17;
        local_68.field_2._8_8_ = plVar14[3];
        local_68._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar17;
        local_68._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_68._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      exception(&local_68);
      _Var20._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar13 != HostData) {
        return (vec<4,_unsigned_int,_(glm::qualifier)0>)ZEXT816(0);
      }
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4)) goto LAB_00229844;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar16 = (ulong *)(plVar14 + 2);
      if ((ulong *)*plVar14 == puVar16) {
        local_b8 = *puVar16;
        lStack_b0 = plVar14[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar16;
        local_c8 = (ulong *)*plVar14;
      }
      local_c0 = plVar14[1];
      *plVar14 = (long)puVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      cVar12 = '\x01';
      if (9 < ind) {
        sVar18 = ind;
        cVar11 = '\x04';
        do {
          cVar12 = cVar11;
          if (sVar18 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00229574;
          }
          if (sVar18 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00229574;
          }
          if (sVar18 < 10000) goto LAB_00229574;
          bVar9 = 99999 < sVar18;
          sVar18 = sVar18 / 10000;
          cVar11 = cVar12 + '\x04';
        } while (bVar9);
        cVar12 = cVar12 + '\x01';
      }
LAB_00229574:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar19 = 0xf;
      if (local_c8 != &local_b8) {
        uVar19 = local_b8;
      }
      if (uVar19 < uVar2) {
        uVar19 = 0xf;
        if (local_108 != local_f8) {
          uVar19 = local_f8[0];
        }
        if (uVar19 < uVar2) goto LAB_002295d6;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_002295d6:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar15 + 2;
      if ((undefined8 *)*puVar15 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar15[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar15;
      }
      local_e0 = puVar15[1];
      *puVar15 = puVar1;
      puVar15[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar21 = &local_48.field_2;
      psVar17 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_48.field_2._M_allocated_capacity = *psVar17;
        local_48.field_2._8_8_ = plVar14[3];
        local_48._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar17;
        local_48._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_48._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      exception(&local_48);
      _Var20._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p != paVar21) {
      operator_delete(_Var20._M_p);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
LAB_00229844:
    pvVar6 = (this->data->
             super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = pvVar6 + ind;
    uVar4 = pvVar3->field_0;
    uVar7 = pvVar3->field_1;
    vVar10.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_unsigned_int,_(glm::qualifier)0>_5)uVar7;
    vVar10.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_unsigned_int,_(glm::qualifier)0>_3)uVar4;
    pvVar6 = pvVar6 + ind;
    uVar5 = pvVar6->field_2;
    uVar8 = pvVar6->field_3;
    vVar10.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_unsigned_int,_(glm::qualifier)0>_9)uVar8;
    vVar10.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_unsigned_int,_(glm::qualifier)0>_7)uVar5;
    return vVar10;
  }
  if ((long)ind <
      ((this->renderAttributeBuffer).
       super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      dataSize) goto LAB_00229561;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar16 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar16) {
    local_b8 = *puVar16;
    lStack_b0 = plVar14[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar16;
    local_c8 = (ulong *)*plVar14;
  }
  local_c0 = plVar14[1];
  *plVar14 = (long)puVar16;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  cVar12 = '\x01';
  if (9 < ind) {
    sVar18 = ind;
    cVar11 = '\x04';
    do {
      cVar12 = cVar11;
      if (sVar18 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_002293d6;
      }
      if (sVar18 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_002293d6;
      }
      if (sVar18 < 10000) goto LAB_002293d6;
      bVar9 = 99999 < sVar18;
      sVar18 = sVar18 / 10000;
      cVar11 = cVar12 + '\x04';
    } while (bVar9);
    cVar12 = cVar12 + '\x01';
  }
LAB_002293d6:
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
  uVar2 = CONCAT44(uStack_fc,local_100) + local_c0;
  uVar19 = 0xf;
  if (local_c8 != &local_b8) {
    uVar19 = local_b8;
  }
  if (uVar19 < uVar2) {
    uVar19 = 0xf;
    if (local_108 != local_f8) {
      uVar19 = local_f8[0];
    }
    if (uVar19 < uVar2) goto LAB_00229438;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00229438:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
  }
  local_e8 = &local_d8;
  puVar1 = puVar15 + 2;
  if ((undefined8 *)*puVar15 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar15[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar15;
  }
  local_e0 = puVar15[1];
  *puVar15 = puVar1;
  puVar15[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_88.field_2._M_allocated_capacity = *psVar17;
    local_88.field_2._8_8_ = plVar14[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar17;
    local_88._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_88._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_00229561:
  uVar22 = getAttributeBufferData<glm::vec<4,unsigned_int,(glm::qualifier)0>>
                     ((this->renderAttributeBuffer).
                      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,ind);
  vVar23.field_0 = uVar22.field_0;
  auVar24._4_4_ = uVar22.field_1;
  register0x00000010 = uVar22.field_2;
  register0x00000014 = uVar22.field_3;
  return vVar23;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}